

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_insert.cpp
# Opt level: O0

ScalarFunction * duckdb::StructInsertFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  bind_scalar_function_extended_t in_stack_00000040;
  bind_scalar_function_t in_stack_00000048;
  scalar_function_t *in_stack_00000050;
  LogicalType *in_stack_00000058;
  vector<duckdb::LogicalType,_true> *in_stack_00000060;
  ScalarFunction *in_stack_00000068;
  function_statistics_t in_stack_000000a0;
  init_local_state_t in_stack_000000a8;
  LogicalType *in_stack_000000b0;
  FunctionStability in_stack_000000b8;
  FunctionNullHandling in_stack_000000c0;
  bind_lambda_function_t in_stack_000000c8;
  ScalarFunction *fun;
  code *other;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  LogicalTypeId in_stack_ffffffffffffff3f;
  LogicalType *in_stack_ffffffffffffff40;
  LogicalType *this_00;
  
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x219d4f8);
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  LogicalType::LogicalType(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f);
  other = StructInsertStats;
  this_00 = (LogicalType *)0x0;
  this = (LogicalType *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048,in_stack_00000040,in_stack_000000a0,in_stack_000000a8,
             in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,in_stack_000000c8);
  LogicalType::~LogicalType((LogicalType *)0x219d596);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x219d5a0);
  LogicalType::~LogicalType((LogicalType *)0x219d5ad);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x219d5ba);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  LogicalType::LogicalType(this_00,in_stack_ffffffffffffff3f);
  LogicalType::operator=(this,(LogicalType *)other);
  LogicalType::~LogicalType((LogicalType *)0x219d5f4);
  in_RDI->serialize = VariableReturnBindData::Serialize;
  in_RDI->deserialize = VariableReturnBindData::Deserialize;
  return in_RDI;
}

Assistant:

ScalarFunction StructInsertFun::GetFunction() {
	ScalarFunction fun({}, LogicalTypeId::STRUCT, StructInsertFunction, StructInsertBind, nullptr, StructInsertStats);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.varargs = LogicalType::ANY;
	fun.serialize = VariableReturnBindData::Serialize;
	fun.deserialize = VariableReturnBindData::Deserialize;
	return fun;
}